

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,Field *params)

{
  int iVar1;
  SegmentReader *pSVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  Entry *pEVar8;
  Field *in_R8;
  long lVar9;
  Maybe<unsigned_long> MVar10;
  
  aVar6.value = table.size_;
  pEVar8 = table.ptr;
  aVar7.value = aVar6.value;
  if ((pEVar8->key).proto._reader.capTable != (CapTableReader *)0x0) {
    uVar3 = capnp::StructSchema::Field::hashCode(in_R8);
    uVar4 = kj::_::chooseBucket((uint)(uVar3 != 0),*(uint *)&(pEVar8->key).proto._reader.capTable);
    pSVar2 = (pEVar8->key).proto._reader.segment;
    aVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (pEVar8->key).proto._reader.capTable;
    while( true ) {
      uVar5 = (ulong)uVar4;
      iVar1 = *(int *)((long)&pSVar2->arena + uVar5 * 8 + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(&pSVar2->arena + uVar5) == (uint)(uVar3 != 0))) {
        lVar9 = (ulong)(iVar1 - 2) * 0x48;
        if ((*(RawBrandedSchema **)(aVar6.value + lVar9) == (in_R8->parent).super_Schema.raw) &&
           (*(uint *)(aVar6.value + 8 + lVar9) == in_R8->index)) {
          *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_003dbfe3;
        }
      }
      uVar4 = (uint)(uVar5 + 1);
      if (uVar5 + 1 == aVar7.value) {
        uVar4 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           )0x0;
LAB_003dbfe3:
  MVar10.ptr.field_1.value = aVar7.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }